

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O1

bool __thiscall
qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::canInsert
          (QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *this,
          gate_type *gate)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  vector<int,_std::allocator<int>_> qubits;
  int *local_30;
  int *local_28;
  long local_20;
  
  (*gate->_vptr_QObject[5])(&local_30);
  piVar3 = local_30 + 1;
  piVar4 = local_30;
  piVar5 = local_30;
  if (piVar3 != local_28 && local_30 != local_28) {
    do {
      piVar4 = piVar3;
      if (*piVar3 <= *piVar5) {
        piVar4 = piVar5;
      }
      piVar3 = piVar3 + 1;
      piVar5 = piVar4;
    } while (piVar3 != local_28);
  }
  iVar1 = *piVar4;
  iVar2 = this->nbQubits_;
  if (local_30 != (int *)0x0) {
    operator_delete(local_30,local_20 - (long)local_30);
  }
  return iVar1 < iVar2;
}

Assistant:

bool canInsert( const gate_type& gate ) const {
        const auto qubits = gate.qubits() ;
        if ( *std::max_element( qubits.begin() , qubits.end() ) >= nbQubits_ ) {
          return false ;
        }
        return true ;
      }